

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

void __thiscall iutest::TempFile::Delete(TempFile *this)

{
  ulong uVar1;
  char *__filename;
  TempFile *this_local;
  
  (*(this->super_IFile).super_IOutStream._vptr_IOutStream[4])();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
    std::__cxx11::string::operator=((string *)&this->m_filename,"");
  }
  return;
}

Assistant:

void Delete()
    {
        Close();
        if( !m_filename.empty() )
        {
            remove(m_filename.c_str());
            m_filename = "";
        }
    }